

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::CommandLineInterface::ErrorPrinter::ErrorPrinter
          (ErrorPrinter *this,ErrorFormat format,DiskSourceTree *tree)

{
  DiskSourceTree *tree_local;
  ErrorFormat format_local;
  ErrorPrinter *this_local;
  
  MultiFileErrorCollector::MultiFileErrorCollector(&this->super_MultiFileErrorCollector);
  io::ErrorCollector::ErrorCollector(&this->super_ErrorCollector);
  DescriptorPool::ErrorCollector::ErrorCollector(&this->super_ErrorCollector);
  (this->super_MultiFileErrorCollector)._vptr_MultiFileErrorCollector =
       (_func_int **)&PTR__ErrorPrinter_008e4c50;
  (this->super_ErrorCollector)._vptr_ErrorCollector = (_func_int **)&DAT_008e4ca0;
  (this->super_ErrorCollector)._vptr_ErrorCollector = (_func_int **)&PTR__ErrorPrinter_008e4cd0;
  this->format_ = format;
  this->tree_ = tree;
  this->found_errors_ = false;
  this->found_warnings_ = false;
  return;
}

Assistant:

ErrorPrinter(ErrorFormat format, DiskSourceTree* tree = NULL)
      : format_(format),
        tree_(tree),
        found_errors_(false),
        found_warnings_(false) {}